

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O3

void __thiscall
Assimp::PLYImporter::LoadFace
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  undefined8 uVar1;
  aiMesh *paVar2;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong *puVar9;
  aiFace *paVar10;
  aiFace *paVar11;
  uint *puVar12;
  ValueUnion VVar13;
  aiVector3D *__s;
  runtime_error *prVar14;
  bool bVar15;
  pointer pPVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar19;
  EDataType EVar20;
  uint32_t uVar21;
  int iVar22;
  double dVar23;
  EDataType EVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  uint32_t uVar29;
  pointer pVVar30;
  float fVar31;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  aiMesh *local_40;
  PLYImporter *local_38;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fd,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fe,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  paVar2 = this->mGeneratedMesh;
  if (paVar2 == (aiMesh *)0x0) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"Invalid .ply file: Vertices should be declared before faces","");
    std::runtime_error::runtime_error(prVar14,(string *)local_60);
    *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcElement->eSemantic == EEST_TriStrip) {
    pPVar16 = (pcElement->alProperties).
              super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pcElement->alProperties).
             super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    EVar20 = EDT_Char;
    if (pPVar16 != pPVar3) {
      iVar26 = 0;
      do {
        if (pPVar16->bIsList == true) {
          EVar24 = pPVar16->eType;
          bVar18 = true;
          goto LAB_004b8406;
        }
        pPVar16 = pPVar16 + 1;
        iVar26 = iVar26 + 1;
      } while (pPVar16 != pPVar3);
    }
    EVar24 = EDT_Char;
    iVar26 = -1;
    bVar18 = false;
LAB_004b8406:
    iVar25 = -1;
    bVar15 = bVar18;
  }
  else {
    if (pcElement->eSemantic != EEST_Face) {
      return;
    }
    pPVar16 = (pcElement->alProperties).
              super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pcElement->alProperties).
             super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar16 == pPVar3) {
      return;
    }
    bVar15 = false;
    iVar26 = -1;
    EVar24 = EDT_Char;
    iVar25 = -1;
    EVar20 = EDT_Char;
    iVar22 = 0;
    do {
      if (pPVar16->Semantic == EST_TextureCoordinates) {
        if (pPVar16->bIsList == true) {
          EVar20 = pPVar16->eType;
          bVar15 = true;
          iVar25 = iVar22;
        }
      }
      else if ((pPVar16->Semantic == EST_VertexIndex) && (pPVar16->bIsList == true)) {
        EVar24 = pPVar16->eType;
        bVar15 = true;
        iVar26 = iVar22;
      }
      pPVar16 = pPVar16 + 1;
      iVar22 = iVar22 + 1;
    } while (pPVar16 != pPVar3);
    bVar18 = false;
  }
  if (bVar15) {
    if (paVar2->mFaces == (aiFace *)0x0) {
      paVar2->mNumFaces = pcElement->NumOccur;
      local_40 = this->mGeneratedMesh;
      uVar17 = (ulong)local_40->mNumFaces;
      puVar9 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
      paVar11 = (aiFace *)(puVar9 + 1);
      *puVar9 = uVar17;
      if (uVar17 != 0) {
        paVar10 = paVar11;
        do {
          paVar10->mNumIndices = 0;
          paVar10->mIndices = (uint *)0x0;
          paVar10 = paVar10 + 1;
        } while (paVar10 != paVar11 + uVar17);
      }
      local_40->mFaces = paVar11;
    }
    local_38 = this;
    if (bVar18) {
      pPVar4 = (instElement->alProperties).
               super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = (ulong)iVar26;
      uVar19 = ((long)(instElement->alProperties).
                      super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
               -0x5555555555555555;
      if (uVar19 < uVar17 || uVar19 - uVar17 == 0) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
        std::runtime_error::runtime_error(prVar14,(string *)local_60);
        *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar30 = *(pointer *)
                 &pPVar4[uVar17].avList.
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      if (pVVar30 !=
          *(pointer *)
           ((long)&pPVar4[uVar17].avList.
                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
           + 8)) {
        uVar21 = 0xffffffff;
        bVar18 = false;
        uVar29 = 0xffffffff;
        do {
          VVar13 = *pVVar30;
          if (EVar24 < EDT_Float) {
LAB_004b850d:
            uVar7 = VVar13.iUInt;
            if (uVar7 != 0xffffffff) goto LAB_004b8519;
            bVar18 = false;
            uVar8 = 0xffffffff;
            uVar6 = 0xffffffff;
          }
          else {
            if (EVar24 == EDT_Double) {
              VVar13._0_4_ = (uint)VVar13.fDouble;
              VVar13._4_4_ = 0;
              goto LAB_004b850d;
            }
            uVar7 = 0;
            if (EVar24 == EDT_Float) {
              VVar13._0_4_ = (uint)VVar13.fFloat;
              VVar13._4_4_ = 0;
              goto LAB_004b850d;
            }
LAB_004b8519:
            uVar8 = uVar29;
            uVar6 = uVar7;
            if ((uVar21 != 0xffffffff) && (uVar8 = uVar7, uVar6 = uVar21, uVar29 != 0xffffffff)) {
              paVar11 = this->mGeneratedMesh->mFaces;
              if (paVar11 == (aiFace *)0x0) {
                this->mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                local_40 = this->mGeneratedMesh;
                uVar19 = (ulong)local_40->mNumFaces;
                puVar9 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
                paVar11 = (aiFace *)(puVar9 + 1);
                *puVar9 = uVar19;
                if (uVar19 != 0) {
                  paVar10 = paVar11;
                  do {
                    paVar10->mNumIndices = 0;
                    paVar10->mIndices = (uint *)0x0;
                    paVar10 = paVar10 + 1;
                  } while (paVar10 != paVar11 + uVar19);
                }
                local_40->mFaces = paVar11;
                paVar11 = local_38->mGeneratedMesh->mFaces;
                this = local_38;
              }
              paVar11[pos].mNumIndices = 3;
              puVar12 = (uint *)operator_new__(0xc);
              this->mGeneratedMesh->mFaces[pos].mIndices = puVar12;
              *this->mGeneratedMesh->mFaces[pos].mIndices = uVar21;
              this->mGeneratedMesh->mFaces[pos].mIndices[1] = uVar29;
              this->mGeneratedMesh->mFaces[pos].mIndices[2] = uVar7;
              bVar18 = !bVar18;
              uVar6 = uVar29;
              if (bVar18) {
                puVar12 = this->mGeneratedMesh->mFaces[pos].mIndices;
                uVar1 = *(undefined8 *)puVar12;
                *(ulong *)puVar12 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
              }
            }
          }
          uVar21 = uVar6;
          pVVar30 = pVVar30 + 1;
          uVar29 = uVar8;
        } while (pVVar30 !=
                 *(pointer *)
                  ((long)&pPVar4[uVar17].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  + 8));
      }
    }
    else {
      if (iVar26 != -1) {
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (ulong)iVar26;
        uVar17 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar17 < uVar19 || uVar17 - uVar19 == 0) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar14,(string *)local_60);
          *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
          __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar17 = (long)*(pointer *)
                        ((long)&pPVar4[uVar19].avList.
                                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                        + 8) -
                 *(long *)&pPVar4[uVar19].avList.
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        uVar28 = uVar17 >> 3;
        uVar27 = (uint)uVar28;
        this->mGeneratedMesh->mFaces[pos].mNumIndices = uVar27;
        puVar12 = (uint *)operator_new__(uVar17 >> 1 & 0x3fffffffc);
        this->mGeneratedMesh->mFaces[pos].mIndices = puVar12;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar17 < uVar19 || uVar17 - uVar19 == 0) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar14,(string *)local_60);
          *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
          __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar27 != 0) {
          lVar5 = *(long *)&pPVar4[uVar19].avList.
                            super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ;
          uVar17 = 0;
          do {
            dVar23 = 0.0;
            if (EVar24 < EDT_INVALID) {
              dVar23 = *(double *)(lVar5 + uVar17 * 8);
              switch(EVar24) {
              case EDT_Float:
                dVar23 = (double)(long)SUB84(dVar23,0);
                break;
              case EDT_Double:
                dVar23 = (double)(long)dVar23;
              }
            }
            this->mGeneratedMesh->mFaces[pos].mIndices[uVar17] = SUB84(dVar23,0);
            uVar17 = uVar17 + 1;
          } while ((uVar28 & 0xffffffff) != uVar17);
        }
      }
      if (iVar25 != -1) {
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (ulong)iVar25;
        uVar19 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar19 < uVar17 || uVar19 - uVar17 == 0) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar14,(string *)local_60);
          *(undefined ***)prVar14 = &PTR__runtime_error_0080bf48;
          __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = *(long *)&pPVar4[uVar17].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        iVar26 = (int)((ulong)((long)*(pointer *)
                                      ((long)&pPVar4[uVar17].avList.
                                              super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                      + 8) - lVar5) >> 3);
        if (iVar26 - 6U < 3) {
          uVar17 = 0;
          do {
            paVar2 = this->mGeneratedMesh;
            uVar27 = paVar2->mFaces[pos].mIndices[uVar17 >> 1 & 0x7fffffff];
            if (uVar27 < paVar2->mNumVertices) {
              if (paVar2->mTextureCoords[0] == (aiVector3D *)0x0) {
                paVar2->mNumUVComponents[0] = 2;
                paVar2 = this->mGeneratedMesh;
                uVar28 = (ulong)paVar2->mNumVertices;
                uVar19 = uVar28 * 0xc;
                __s = (aiVector3D *)operator_new__(uVar19);
                if (uVar28 != 0) {
                  memset(__s,0,((uVar19 - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar2->mTextureCoords[0] = __s;
                this = local_38;
              }
              dVar23 = *(double *)(lVar5 + uVar17 * 8);
              fVar31 = SUB84(dVar23,0);
              if ((uVar17 & 1) == 0) {
                switch(EVar20) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar31 = (float)(int)fVar31;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar31 = (float)((ulong)dVar23 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar31 = (float)dVar23;
                  break;
                default:
                  fVar31 = 0.0;
                }
                this->mGeneratedMesh->mTextureCoords[0][uVar27].x = fVar31;
              }
              else {
                switch(EVar20) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar31 = (float)(int)fVar31;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar31 = (float)((ulong)dVar23 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar31 = (float)dVar23;
                  break;
                default:
                  fVar31 = 0.0;
                }
                this->mGeneratedMesh->mTextureCoords[0][uVar27].y = fVar31;
              }
              this->mGeneratedMesh->mTextureCoords[0][uVar27].z = 0.0;
            }
            uVar17 = uVar17 + 1;
          } while (iVar26 != (int)uVar17);
        }
      }
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadFace(const PLY::Element* pcElement, const PLY::ElementInstance* instElement,
        unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Vertices should be declared before faces");
    }

    bool bOne = false;

    // index of the vertex index list
    unsigned int iProperty = 0xFFFFFFFF;
    PLY::EDataType eType = EDT_Char;
    bool bIsTriStrip = false;

    // index of the material index property
    //unsigned int iMaterialIndex = 0xFFFFFFFF;
    //PLY::EDataType eType2 = EDT_Char;

    // texture coordinates
    unsigned int iTextureCoord = 0xFFFFFFFF;
    PLY::EDataType eType3 = EDT_Char;

    // face = unique number of vertex indices
    if (PLY::EEST_Face == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            if (PLY::EST_VertexIndex == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }

                iProperty = _a;
                bOne = true;
                eType = (*a).eType;
            } else if (PLY::EST_TextureCoordinates == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }
                iTextureCoord = _a;
                bOne = true;
                eType3 = (*a).eType;
            }
        }
    }
    // triangle strip
    // TODO: triangle strip and material index support???
    else if (PLY::EEST_TriStrip == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            // must be a dynamic list!
            if (!(*a).bIsList) {
                continue;
            }
            iProperty = _a;
            bOne = true;
            bIsTriStrip = true;
            eType = (*a).eType;
            break;
        }
    }

    // check whether we have at least one per-face information set
    if (bOne) {
        if (mGeneratedMesh->mFaces == nullptr) {
            mGeneratedMesh->mNumFaces = pcElement->NumOccur;
            mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
        }

        if (!bIsTriStrip) {
            // parse the list of vertex indices
            if (0xFFFFFFFF != iProperty) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iProperty).avList.size();
                mGeneratedMesh->mFaces[pos].mNumIndices = iNum;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[iNum];

                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iProperty).avList.begin();

                for (unsigned int a = 0; a < iNum; ++a, ++p) {
                    mGeneratedMesh->mFaces[pos].mIndices[a] = PLY::PropertyInstance::ConvertTo<unsigned int>(*p, eType);
                }
            }

        // parse the material index
        // cannot be handled without processing the whole file first
        /*if (0xFFFFFFFF != iMaterialIndex)
        {
            mGeneratedMesh->mFaces[pos]. = PLY::PropertyInstance::ConvertTo<unsigned int>(
            GetProperty(instElement->alProperties, iMaterialIndex).avList.front(), eType2);
        }*/

            if (0xFFFFFFFF != iTextureCoord) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iTextureCoord).avList.size();

                //should be 6 coords
                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iTextureCoord).avList.begin();

                if ((iNum / 3) == 2) // X Y coord
                {
                    for (unsigned int a = 0; a < iNum; ++a, ++p) {
                        unsigned int vindex = mGeneratedMesh->mFaces[pos].mIndices[a / 2];
                        if (vindex < mGeneratedMesh->mNumVertices) {
                            if (mGeneratedMesh->mTextureCoords[0] == nullptr ) {
                                mGeneratedMesh->mNumUVComponents[0] = 2;
                                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
                            }

                            if (a % 2 == 0) {
                                mGeneratedMesh->mTextureCoords[0][vindex].x = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            } else {
                                mGeneratedMesh->mTextureCoords[0][vindex].y = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            }

                            mGeneratedMesh->mTextureCoords[0][vindex].z = 0;
                        }
                    }
                }
            }
        } else { // triangle strips
            // normally we have only one triangle strip instance where
            // a value of -1 indicates a restart of the strip
            bool flip = false;
            const std::vector<PLY::PropertyInstance::ValueUnion>& quak = GetProperty(instElement->alProperties, iProperty).avList;
            //pvOut->reserve(pvOut->size() + quak.size() + (quak.size()>>2u)); //Limits memory consumption

            int aiTable[2] = { -1, -1 };
            for (std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator a = quak.begin(); a != quak.end(); ++a)  {
                const int p = PLY::PropertyInstance::ConvertTo<int>(*a, eType);

                if (-1 == p) {
                    // restart the strip ...
                    aiTable[0] = aiTable[1] = -1;
                    flip = false;
                    continue;
                }
                if (-1 == aiTable[0]) {
                    aiTable[0] = p;
                    continue;
                }
                if (-1 == aiTable[1]) {
                    aiTable[1] = p;
                    continue;
                }

                if (mGeneratedMesh->mFaces == nullptr) {
                    mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                    mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
                }

                mGeneratedMesh->mFaces[pos].mNumIndices = 3;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[3];
                mGeneratedMesh->mFaces[pos].mIndices[0] = aiTable[0];
                mGeneratedMesh->mFaces[pos].mIndices[1] = aiTable[1];
                mGeneratedMesh->mFaces[pos].mIndices[2] = p;

                // every second pass swap the indices.
                flip = !flip;
                if ( flip ) {
                    std::swap(mGeneratedMesh->mFaces[pos].mIndices[0], mGeneratedMesh->mFaces[pos].mIndices[1]);
                }

                aiTable[0] = aiTable[1];
                aiTable[1] = p;
            }
        }
    }
}